

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O0

void __thiscall
IOContextDemuxer::IOContextDemuxer(IOContextDemuxer *this,BufferedReaderManager *readManager)

{
  int iVar1;
  AbstractReader *pAVar2;
  BufferedReaderManager *readManager_local;
  IOContextDemuxer *this_local;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__IOContextDemuxer_00440de8;
  memset(this->tracks,0,0x200);
  this->m_readManager = readManager;
  this->m_lastReadRez = 0;
  this->m_lastProcessedBytes = 0;
  pAVar2 = BufferedReaderManager::getReader(this->m_readManager,"");
  this->m_bufferedReader = pAVar2;
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[6])(this->m_bufferedReader,0xbc);
  this->m_readerID = iVar1;
  this->m_bufEnd = (uint8_t *)0x0;
  this->m_curPos = (uint8_t *)0x0;
  this->m_processedBytes = 0;
  this->m_isEOF = false;
  this->num_tracks = 0;
  return;
}

Assistant:

IOContextDemuxer::IOContextDemuxer(const BufferedReaderManager& readManager)
    : tracks(), m_readManager(readManager), m_lastReadRez(0)
{
    m_lastProcessedBytes = 0;
    m_bufferedReader = m_readManager.getReader("");
    m_readerID = m_bufferedReader->createReader(TS_FRAME_SIZE);
    m_curPos = m_bufEnd = nullptr;
    m_processedBytes = 0;
    m_isEOF = false;
    num_tracks = 0;
}